

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# derived_classes.cpp
# Opt level: O2

void __thiscall Derived21::Print(Derived21 *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Derived21 (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Base2).id_);
  std::operator<<(poVar1,"): ");
  (*((this->super_Base2).printer_)->_vptr_Base1[2])();
  return;
}

Assistant:

void Derived21::Print() const {
  std::cout << "Derived21 (" << id() << "): ";
  printer()->Print();
}